

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaemonClient.cpp
# Opt level: O2

void __thiscall xmrig::DaemonClient::retry(DaemonClient *this)

{
  IClientListener *pIVar1;
  
  pIVar1 = (this->super_BaseClient).m_listener;
  (this->super_BaseClient).m_failures = (this->super_BaseClient).m_failures + 1;
  (*pIVar1->_vptr_IClientListener[2])(pIVar1,this);
  if ((this->super_BaseClient).m_failures != -1) {
    if ((this->super_BaseClient).m_state == ConnectedState) {
      (this->super_BaseClient).m_state = ConnectingState;
    }
    Timer::stop(this->m_timer);
    Timer::start(this->m_timer,(this->super_BaseClient).m_retryPause,0);
    return;
  }
  return;
}

Assistant:

void xmrig::DaemonClient::retry()
{
    m_failures++;
    m_listener->onClose(this, static_cast<int>(m_failures));

    if (m_failures == -1) {
        return;
    }

    if (m_state == ConnectedState) {
        setState(ConnectingState);
    }

    m_timer->stop();
    m_timer->start(m_retryPause, 0);
}